

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

int linklist_5_3::get_common_arr(int *a,int n1,int *b,int n2)

{
  int iVar1;
  sqlist_5_3 *this;
  int *piVar2;
  int *piVar3;
  int iVar4;
  undefined4 in_register_00000034;
  int iVar5;
  int iVar6;
  
  iVar4 = n1;
  this = (sqlist_5_3 *)malloc(0x10);
  *(undefined8 *)(this + 8) = 0;
  if ((0 < n1) && (0 < n2)) {
    piVar3 = (int *)0x0;
    iVar5 = 0;
    iVar6 = 0;
    do {
      iVar1 = a[iVar5];
      if (iVar1 == b[iVar6]) {
        piVar2 = (int *)malloc(0x10);
        *piVar2 = iVar1;
        *(int **)(piVar2 + 2) = piVar3;
        *(int **)(this + 8) = piVar2;
        iVar5 = iVar5 + 1;
        iVar6 = iVar6 + 1;
        piVar3 = piVar2;
      }
      else if (iVar1 < b[iVar6]) {
        iVar5 = iVar5 + 1;
      }
      else {
        iVar6 = iVar6 + 1;
      }
    } while ((iVar5 < n1) && (iVar6 < n2));
  }
  sqlist_5_3::test_1(this,(LinkList)CONCAT44(in_register_00000034,iVar4));
}

Assistant:

int get_common_arr(int *a, int n1, int *b, int n2) {
        int i = 0, j = 0;
        LinkList list = newNode, p, q;
        list->next = nullptr;
        q = list;
        while (i < n1 && j < n2) {
            if (a[i] == b[j]) {
                p = newNode;
                p->data = a[i];
//                q->next = p;
//                q = p;
                p->next = q->next;
                q->next = p;
                i++;
                j++;
            } else if (a[i] < b[j]) {
                i++;
            } else {
                j++;
            }
        }
        ps_link_list(list);
        ps_link_list(q);
    }